

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O3

void __thiscall LockedPool::free(LockedPool *this,void *__ptr)

{
  mutex *__mutex;
  long lVar1;
  int iVar2;
  runtime_error *this_00;
  undefined8 uVar3;
  _List_node_base *p_Var4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = &this->mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    p_Var4 = (_List_node_base *)&this->arenas;
    do {
      p_Var4 = (((_List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var4 == (_List_node_base *)&this->arenas) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"LockedPool: invalid address not pointing to any arena");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0040b59a;
      }
    } while ((__ptr < p_Var4[0xf]._M_next) || (p_Var4[0xf]._M_prev <= __ptr));
    Arena::free((Arena *)(p_Var4 + 1),__ptr);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    uVar3 = std::__throw_system_error(iVar2);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar3);
    }
  }
LAB_0040b59a:
  __stack_chk_fail();
}

Assistant:

void LockedPool::free(void *ptr)
{
    std::lock_guard<std::mutex> lock(mutex);
    // TODO we can do better than this linear search by keeping a map of arena
    // extents to arena, and looking up the address.
    for (auto &arena: arenas) {
        if (arena.addressInArena(ptr)) {
            arena.free(ptr);
            return;
        }
    }
    throw std::runtime_error("LockedPool: invalid address not pointing to any arena");
}